

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDeclGroup(NodeDiffComputer *this,DeclGroup *lhs,DeclGroup *rhs)

{
  size_type_conflict sVar1;
  size_type_conflict sVar2;
  size_type_conflict sVar3;
  ArenaVector<SQCompilation::VarDecl_*> *this_00;
  ArenaVector<SQCompilation::VarDecl_*> *this_01;
  DeclGroup *in_RDX;
  DeclGroup *in_RSI;
  VarDecl *in_RDI;
  int32_t tmp;
  VarDecl *r;
  VarDecl *l;
  int32_t i;
  int32_t result;
  ArenaVector<SQCompilation::VarDecl_*> *rightGroup;
  ArenaVector<SQCompilation::VarDecl_*> *leftGroup;
  undefined4 in_stack_ffffffffffffffa4;
  int32_t in_stack_ffffffffffffffb4;
  size_type_conflict local_38;
  int local_34;
  int32_t local_4;
  
  this_00 = DeclGroup::declarations(in_RSI);
  this_01 = DeclGroup::declarations(in_RDX);
  sVar1 = ArenaVector<SQCompilation::VarDecl_*>::size(this_00);
  sVar2 = ArenaVector<SQCompilation::VarDecl_*>::size(this_01);
  if (sVar1 == sVar2) {
    local_34 = 0;
    local_38 = 0;
    while (sVar2 = local_38, sVar3 = ArenaVector<SQCompilation::VarDecl_*>::size(this_00),
          sVar2 < sVar3) {
      ArenaVector<SQCompilation::VarDecl_*>::operator[](this_00,local_38);
      ArenaVector<SQCompilation::VarDecl_*>::operator[](this_01,local_38);
      in_stack_ffffffffffffffb4 =
           diffVarDecl((NodeDiffComputer *)CONCAT44(in_stack_ffffffffffffffb4,sVar1),in_RDI,
                       (VarDecl *)CONCAT44(in_stack_ffffffffffffffa4,sVar2));
      if (*(int *)((long)&(in_RDI->super_ValueDecl)._expr + 4) < in_stack_ffffffffffffffb4) {
        return in_stack_ffffffffffffffb4;
      }
      local_34 = in_stack_ffffffffffffffb4 + local_34;
      local_38 = local_38 + 1;
    }
    local_4 = local_34;
  }
  else {
    sVar1 = ArenaVector<SQCompilation::VarDecl_*>::size(this_00);
    sVar2 = ArenaVector<SQCompilation::VarDecl_*>::size(this_01);
    local_4 = sizeDiff((NodeDiffComputer *)in_RDI,sVar1,sVar2);
  }
  return local_4;
}

Assistant:

int32_t diffDeclGroup(const DeclGroup *lhs, const DeclGroup *rhs) {
    const auto &leftGroup = lhs->declarations();
    const auto &rightGroup = rhs->declarations();

    if (leftGroup.size() != rightGroup.size())
      return sizeDiff(leftGroup.size(), rightGroup.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftGroup.size(); ++i) {
      const VarDecl *l = leftGroup[i];
      const VarDecl *r = rightGroup[i];

      int32_t tmp = diffVarDecl(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }